

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Key.cpp
# Opt level: O1

void MiniScript::KeyPutString(String *s,bool inFront)

{
  long *plVar1;
  StringStorage *pSVar2;
  bool bVar3;
  ulong *puVar4;
  uint uVar5;
  long lVar6;
  unsigned_long uVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong *puVar10;
  ulong *puVar11;
  undefined7 in_register_00000031;
  uchar *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  String character;
  String local_58;
  String *local_48;
  unsigned_long local_40;
  long local_38;
  
  local_48 = s;
  if ((int)CONCAT71(in_register_00000031,inFront) == 0) {
    lVar17 = 0;
    while( true ) {
      pSVar2 = s->ss;
      if (pSVar2 == (StringStorage *)0x0) {
        lVar6 = 0;
      }
      else {
        if (pSVar2->charCount < 0) {
          StringStorage::analyzeChars(pSVar2);
        }
        lVar6 = s->ss->charCount;
      }
      if (lVar6 <= lVar17) break;
      String::Substring(&local_58,(long)s,lVar17);
      puVar12 = "";
      if (local_58.ss != (StringStorage *)0x0) {
        puVar12 = (uchar *)(local_58.ss)->data;
      }
      local_40 = UTF8Decode(puVar12);
      local_38 = lVar17;
      if (DAT_001d2d18 <= DAT_001d2d10) {
        do {
          uVar14 = DAT_001d2d10;
          uVar16 = inputBuffer;
          if (inputBuffer == 0) {
            uVar16 = DAT_001d2d18;
          }
          if (uVar16 < 0x11) {
            uVar16 = 0x10;
          }
          uVar16 = uVar16 + DAT_001d2d18;
          uVar15 = uVar16 * 8;
          if (0x1fffffffffffffff < uVar16) {
            uVar15 = 0xffffffffffffffff;
          }
          puVar8 = (ulong *)operator_new__(uVar15);
          puVar4 = DAT_001d2d08;
          if (DAT_001d2d08 != (ulong *)0x0) {
            if ((long)uVar16 <= (long)uVar14) {
              uVar14 = uVar16;
            }
            if (0 < (long)uVar14) {
              puVar10 = DAT_001d2d08 + uVar14;
              puVar9 = DAT_001d2d08;
              puVar11 = puVar8;
              do {
                uVar14 = *puVar9;
                puVar9 = puVar9 + 1;
                *puVar11 = uVar14;
                puVar11 = puVar11 + 1;
              } while (puVar9 < puVar10);
            }
            operator_delete__(puVar4);
          }
          if (uVar16 < DAT_001d2d10) {
            DAT_001d2d10 = uVar16;
          }
          DAT_001d2d08 = puVar8;
          DAT_001d2d18 = uVar16;
        } while (uVar16 <= DAT_001d2d10);
      }
      lVar17 = local_38;
      s = local_48;
      DAT_001d2d08[DAT_001d2d10] = local_40 & 0xffffffff;
      DAT_001d2d10 = DAT_001d2d10 + 1;
      if ((local_58.ss != (StringStorage *)0x0) && (local_58.isTemp == false)) {
        plVar1 = &((local_58.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_58.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_58.ss = (StringStorage *)0x0;
      }
      lVar17 = lVar17 + 1;
    }
  }
  else {
    pSVar2 = s->ss;
    if (pSVar2 == (StringStorage *)0x0) {
      uVar5 = 0xffffffff;
    }
    else {
      if (pSVar2->charCount < 0) {
        StringStorage::analyzeChars(pSVar2);
      }
      uVar5 = (int)s->ss->charCount - 1;
    }
    if (-1 < (int)uVar5) {
      uVar14 = (ulong)uVar5;
      do {
        String::Substring(&local_58,(long)s,uVar14);
        puVar12 = "";
        if (local_58.ss != (StringStorage *)0x0) {
          puVar12 = (uchar *)(local_58.ss)->data;
        }
        uVar7 = UTF8Decode(puVar12);
        if ((long)DAT_001d2d10 < 0) {
          _Error("invalid index in SimpleVector::insert",
                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                 ,0x124);
        }
        else {
          while (uVar16 = DAT_001d2d10, puVar4 = DAT_001d2d08, DAT_001d2d18 <= DAT_001d2d10) {
            uVar15 = inputBuffer;
            if (inputBuffer == 0) {
              uVar15 = DAT_001d2d18;
            }
            if (uVar15 < 0x11) {
              uVar15 = 0x10;
            }
            uVar15 = uVar15 + DAT_001d2d18;
            uVar13 = uVar15 * 8;
            if (0x1fffffffffffffff < uVar15) {
              uVar13 = 0xffffffffffffffff;
            }
            puVar8 = (ulong *)operator_new__(uVar13);
            puVar4 = DAT_001d2d08;
            if (DAT_001d2d08 != (ulong *)0x0) {
              if ((long)uVar15 <= (long)uVar16) {
                uVar16 = uVar15;
              }
              if (0 < (long)uVar16) {
                puVar10 = DAT_001d2d08 + uVar16;
                puVar9 = DAT_001d2d08;
                puVar11 = puVar8;
                do {
                  uVar16 = *puVar9;
                  puVar9 = puVar9 + 1;
                  *puVar11 = uVar16;
                  puVar11 = puVar11 + 1;
                } while (puVar9 < puVar10);
              }
              operator_delete__(puVar4);
            }
            DAT_001d2d08 = puVar8;
            DAT_001d2d18 = uVar15;
            if (uVar15 < DAT_001d2d10) {
              DAT_001d2d10 = uVar15;
            }
          }
          if (0 < (long)DAT_001d2d10) {
            puVar8 = DAT_001d2d08 + DAT_001d2d10;
            while (puVar10 = puVar8 + -1, puVar4 <= puVar10) {
              *puVar8 = *puVar10;
              puVar8 = puVar10;
            }
          }
          *DAT_001d2d08 = uVar7 & 0xffffffff;
          DAT_001d2d10 = DAT_001d2d10 + 1;
          s = local_48;
        }
        if ((local_58.ss != (StringStorage *)0x0) && (local_58.isTemp == false)) {
          plVar1 = &((local_58.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_58.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_58.ss = (StringStorage *)0x0;
        }
        bVar3 = 0 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar3);
    }
  }
  return;
}

Assistant:

void KeyPutString(String s, bool inFront) {
	if (inFront) {
		for (int i=s.Length()-1; i>=0; i--) {
			struct InputBufferEntry e = {0, 0};
			String character = s.Substring(i, 1);
			e.c = UTF8Decode((unsigned char *)character.c_str());
			inputBuffer.insert(e, 0);
		}
	} else {
		for (int i=0; i<s.Length(); i++) {
			struct InputBufferEntry e = {0, 0};
			String character = s.Substring(i, 1);
			e.c = UTF8Decode((unsigned char *)character.c_str());
			inputBuffer.push_back(e);
		}
	}
}